

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day14a.cpp
# Opt level: O2

void day14a::run(void)

{
  ostream *poVar1;
  allocator local_29;
  string local_28;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"day14a ");
  std::__cxx11::string::string((string *)&local_28,"ahsbgdzn",&local_29);
  get_index(&local_28,0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"day14b ");
  std::__cxx11::string::string((string *)&local_28,"ahsbgdzn",&local_29);
  get_index(&local_28,0x7e0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void run() {
		std::cout << "day14a " << get_index("ahsbgdzn", 0) << '\n';
		std::cout << "day14b " << get_index("ahsbgdzn", 2016) << '\n';
		//std::cout << "day14a " << get_index("abc", 0) << '\n';
		//std::cout << "day14a " << get_index("abc", 2016) << '\n';
	}